

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O3

char * match(MatchState *ms,char *s,char *p)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  char *pcVar6;
  ulong uVar7;
  ptrdiff_t *ppVar8;
  byte *pbVar9;
  bool bVar10;
  
LAB_00113e55:
  pbVar5 = (byte *)p;
LAB_00113e5c:
  while (bVar2 = *pbVar5, bVar2 == 0x25) {
    bVar2 = pbVar5[1];
    if (bVar2 != 0x66) {
      if (bVar2 == 0x62) {
        bVar2 = pbVar5[2];
        if ((bVar2 == 0) || (pbVar5[3] == 0)) {
          luaL_error(ms->L,"unbalanced pattern");
          bVar2 = pbVar5[2];
        }
        if (*s != bVar2) goto LAB_00114135;
        pbVar9 = (byte *)s + 1;
        if (ms->src_end <= pbVar9) goto LAB_00114135;
        iVar3 = 1;
        goto LAB_00113fc2;
      }
      if (9 < bVar2 - 0x30) goto LAB_00113f1f;
      if (((bVar2 < 0x31) || (uVar4 = bVar2 - 0x31, ms->level <= (int)uVar4)) ||
         (ms->capture[uVar4].len == -1)) {
        uVar4 = luaL_error(ms->L,"invalid capture index");
      }
      uVar7 = ms->capture[(int)uVar4].len;
      if (((ulong)((long)ms->src_end - (long)s) < uVar7) ||
         (iVar3 = bcmp(ms->capture[(int)uVar4].init,s,uVar7), iVar3 != 0)) goto LAB_00114135;
      if ((byte *)s == (byte *)0x0) {
        return (char *)0x0;
      }
      p = (char *)(pbVar5 + 2);
      s = (char *)((byte *)s + uVar7);
      goto LAB_00113e55;
    }
    if (pbVar5[2] != 0x5b) {
      luaL_error(ms->L,"missing \'[\' after \'%%f\' in pattern");
    }
    pbVar9 = pbVar5 + 2;
    pbVar5 = (byte *)classend(ms,(char *)pbVar9);
    if (s == ms->src_init) {
      uVar4 = 0;
    }
    else {
      uVar4 = (uint)((byte *)s)[-1];
    }
    iVar3 = matchbracketclass(uVar4,(char *)pbVar9,(char *)(pbVar5 + -1));
    if ((iVar3 != 0) ||
       (iVar3 = matchbracketclass((uint)(byte)*s,(char *)pbVar9,(char *)(pbVar5 + -1)), iVar3 == 0))
    goto LAB_00114135;
  }
  if (bVar2 < 0x28) {
    if (bVar2 == 0) {
      return (char *)(byte *)s;
    }
    if ((bVar2 == 0x24) && (pbVar5[1] == 0)) {
      if (s != ms->src_end) {
        return (char *)0x0;
      }
      return (char *)(byte *)s;
    }
  }
  else {
    if (bVar2 == 0x29) {
      uVar7 = (ulong)(uint)ms->level;
      ppVar8 = &ms->capture[uVar7 - 1].len;
      goto LAB_001140bf;
    }
    if (bVar2 == 0x28) {
      if (pbVar5[1] == 0x29) {
        pbVar5 = pbVar5 + 2;
        iVar3 = -2;
      }
      else {
        pbVar5 = pbVar5 + 1;
        iVar3 = -1;
      }
      pcVar6 = start_capture(ms,s,(char *)pbVar5,iVar3);
      return pcVar6;
    }
  }
LAB_00113f1f:
  p = classend(ms,(char *)pbVar5);
  if (s < ms->src_end) {
    iVar3 = singlematch((uint)(byte)*s,(char *)pbVar5,p);
    bVar10 = iVar3 != 0;
  }
  else {
    bVar10 = false;
  }
  bVar2 = *p;
  if (bVar2 == 0x3f) {
    if ((bVar10) &&
       (pcVar6 = match(ms,(char *)((byte *)s + 1),(char *)((byte *)p + 1)), pcVar6 != (char *)0x0))
    {
      return pcVar6;
    }
    pbVar5 = (byte *)p + 1;
    goto LAB_00113e5c;
  }
  if (bVar2 == 0x2a) {
LAB_00114171:
    pcVar6 = max_expand(ms,s,(char *)pbVar5,p);
    return pcVar6;
  }
  if (bVar2 == 0x2b) {
    if (bVar10) {
      s = (char *)((byte *)s + 1);
      goto LAB_00114171;
    }
  }
  else {
    if (bVar2 != 0x2d) goto code_r0x00114005;
    while( true ) {
      pcVar6 = match(ms,s,(char *)((byte *)p + 1));
      if (pcVar6 != (char *)0x0) {
        return pcVar6;
      }
      if ((ms->src_end <= s) || (iVar3 = singlematch((uint)(byte)*s,(char *)pbVar5,p), iVar3 == 0))
      break;
      s = (char *)((byte *)s + 1);
    }
  }
  goto LAB_00114135;
LAB_00113fc2:
  if (*pbVar9 == pbVar5[3]) {
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) goto LAB_00114015;
  }
  else {
    iVar3 = iVar3 + (uint)(*pbVar9 == bVar2);
  }
  pbVar9 = pbVar9 + 1;
  if (pbVar9 == (byte *)ms->src_end) goto LAB_00114135;
  goto LAB_00113fc2;
LAB_00114015:
  p = (char *)(pbVar5 + 4);
  s = (char *)(pbVar9 + 1);
  goto LAB_00113e55;
code_r0x00114005:
  s = (char *)((byte *)s + 1);
  if (!bVar10) goto LAB_00114135;
  goto LAB_00113e55;
  while( true ) {
    uVar4 = (int)uVar7 - 1;
    uVar7 = (ulong)uVar4;
    lVar1 = *ppVar8;
    ppVar8 = ppVar8 + -2;
    if (lVar1 == -1) break;
LAB_001140bf:
    if ((int)uVar7 < 1) {
      uVar4 = luaL_error(ms->L,"invalid pattern capture");
      break;
    }
  }
  ms->capture[(int)uVar4].len = (long)s - (long)ms->capture[(int)uVar4].init;
  pcVar6 = match(ms,s,(char *)(pbVar5 + 1));
  if (pcVar6 == (char *)0x0) {
    ms->capture[(int)uVar4].len = -1;
LAB_00114135:
    pcVar6 = (char *)0x0;
  }
  return pcVar6;
}

Assistant:

static const char *match (MatchState *ms, const char *s, const char *p) {
  init: /* using goto's to optimize tail recursion */
  switch (*p) {
    case '(': {  /* start capture */
      if (*(p+1) == ')')  /* position capture? */
        return start_capture(ms, s, p+2, CAP_POSITION);
      else
        return start_capture(ms, s, p+1, CAP_UNFINISHED);
    }
    case ')': {  /* end capture */
      return end_capture(ms, s, p+1);
    }
    case L_ESC: {
      switch (*(p+1)) {
        case 'b': {  /* balanced string? */
          s = matchbalance(ms, s, p+2);
          if (s == NULL) return NULL;
          p+=4; goto init;  /* else return match(ms, s, p+4); */
        }
        case 'f': {  /* frontier? */
          const char *ep; char previous;
          p += 2;
          if (*p != '[')
            luaL_error(ms->L, "missing " LUA_QL("[") " after "
                               LUA_QL("%%f") " in pattern");
          ep = classend(ms, p);  /* points to what is next */
          previous = (s == ms->src_init) ? '\0' : *(s-1);
          if (matchbracketclass(uchar(previous), p, ep-1) ||
             !matchbracketclass(uchar(*s), p, ep-1)) return NULL;
          p=ep; goto init;  /* else return match(ms, s, ep); */
        }
        default: {
          if (isdigit(uchar(*(p+1)))) {  /* capture results (%0-%9)? */
            s = match_capture(ms, s, uchar(*(p+1)));
            if (s == NULL) return NULL;
            p+=2; goto init;  /* else return match(ms, s, p+2) */
          }
          goto dflt;  /* case default */
        }
      }
    }
    case '\0': {  /* end of pattern */
      return s;  /* match succeeded */
    }
    case '$': {
      if (*(p+1) == '\0')  /* is the `$' the last char in pattern? */
        return (s == ms->src_end) ? s : NULL;  /* check end of string */
      else goto dflt;
    }
    default: dflt: {  /* it is a pattern item */
      const char *ep = classend(ms, p);  /* points to what is next */
      int m = s<ms->src_end && singlematch(uchar(*s), p, ep);
      switch (*ep) {
        case '?': {  /* optional */
          const char *res;
          if (m && ((res=match(ms, s+1, ep+1)) != NULL))
            return res;
          p=ep+1; goto init;  /* else return match(ms, s, ep+1); */
        }
        case '*': {  /* 0 or more repetitions */
          return max_expand(ms, s, p, ep);
        }
        case '+': {  /* 1 or more repetitions */
          return (m ? max_expand(ms, s+1, p, ep) : NULL);
        }
        case '-': {  /* 0 or more repetitions (minimum) */
          return min_expand(ms, s, p, ep);
        }
        default: {
          if (!m) return NULL;
          s++; p=ep; goto init;  /* else return match(ms, s+1, ep); */
        }
      }
    }
  }
}